

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

void bc_trie_insert(bc_trie_t *trie,char *key,void *data)

{
  bc_trie_node_t *pbVar1;
  bool bVar2;
  bc_trie_node_t *local_48;
  bc_trie_node_t *local_40;
  bc_trie_node_t *tmp;
  bc_trie_node_t *current;
  bc_trie_node_t *previous;
  bc_trie_node_t *parent;
  void *data_local;
  char *key_local;
  bc_trie_t *trie_local;
  
  if (((trie != (bc_trie_t *)0x0) && (key != (char *)0x0)) && (data != (void *)0x0)) {
    previous = (bc_trie_node_t *)0x0;
    data_local = key;
    while( true ) {
      if ((trie->root == (bc_trie_node_t *)0x0) ||
         ((previous != (bc_trie_node_t *)0x0 && (previous->child == (_bc_trie_node_t *)0x0)))) {
        pbVar1 = (bc_trie_node_t *)bc_malloc(0x20);
        pbVar1->key = *data_local;
        pbVar1->data = (void *)0x0;
        pbVar1->next = (_bc_trie_node_t *)0x0;
        pbVar1->child = (_bc_trie_node_t *)0x0;
        if (trie->root == (bc_trie_node_t *)0x0) {
          trie->root = pbVar1;
          previous = pbVar1;
        }
        else {
          previous->child = pbVar1;
          previous = pbVar1;
        }
      }
      else {
        if (previous == (bc_trie_node_t *)0x0) {
          local_48 = trie->root;
        }
        else {
          local_48 = previous->child;
        }
        local_40 = local_48;
        current = (bc_trie_node_t *)0x0;
        while( true ) {
          bVar2 = false;
          if (local_40 != (bc_trie_node_t *)0x0) {
            bVar2 = local_40->key != *data_local;
          }
          if (!bVar2) break;
          current = local_40;
          local_40 = local_40->next;
        }
        previous = local_40;
        if ((current != (bc_trie_node_t *)0x0) && (local_40 == (bc_trie_node_t *)0x0)) {
          previous = (bc_trie_node_t *)bc_malloc(0x20);
          previous->key = *data_local;
          previous->data = (void *)0x0;
          previous->next = (_bc_trie_node_t *)0x0;
          previous->child = (_bc_trie_node_t *)0x0;
          current->next = previous;
        }
      }
      if (*data_local == '\0') break;
      data_local = (void *)((long)data_local + 1);
    }
    if ((previous->data != (void *)0x0) && (trie->free_func != (bc_free_func_t)0x0)) {
      (*trie->free_func)(previous->data);
    }
    previous->data = data;
  }
  return;
}

Assistant:

void
bc_trie_insert(bc_trie_t *trie, const char *key, void *data)
{
    if (trie == NULL || key == NULL || data == NULL)
        return;

    bc_trie_node_t *parent = NULL;
    bc_trie_node_t *previous;
    bc_trie_node_t *current;
    bc_trie_node_t *tmp;

    while (1) {

        if (trie->root == NULL || (parent != NULL && parent->child == NULL)) {
            current = bc_malloc(sizeof(bc_trie_node_t));
            current->key = *key;
            current->data = NULL;
            current->next = NULL;
            current->child = NULL;
            if (trie->root == NULL)
                trie->root = current;
            else
                parent->child = current;
            parent = current;
            goto clean;
        }

        tmp = parent == NULL ? trie->root : parent->child;
        previous = NULL;

        while (tmp != NULL && tmp->key != *key) {
            previous = tmp;
            tmp = tmp->next;
        }

        parent = tmp;

        if (previous == NULL || parent != NULL)
            goto clean;

        current = bc_malloc(sizeof(bc_trie_node_t));
        current->key = *key;
        current->data = NULL;
        current->next = NULL;
        current->child = NULL;
        previous->next = current;
        parent = current;

clean:
        if (*key == '\0') {
            if (parent->data != NULL && trie->free_func != NULL)
                trie->free_func(parent->data);
            parent->data = data;
            break;
        }
        key++;
    }
}